

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int P_FindLineSpecial(char *string,int *min_args,int *max_args)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = 0;
  iVar1 = 0xf6;
  while( true ) {
    iVar5 = iVar1;
    if (iVar5 < iVar4) {
      return 0;
    }
    iVar2 = (iVar5 + iVar4) / 2;
    iVar3 = strcasecmp(string,LineSpecialNames[iVar2].name);
    if (iVar3 == 0) break;
    iVar1 = iVar2 + -1;
    if (0 < iVar3) {
      iVar4 = iVar2 + 1;
      iVar1 = iVar5;
    }
  }
  if (min_args != (int *)0x0) {
    *min_args = (int)LineSpecialNames[iVar2].min_args;
  }
  if (max_args != (int *)0x0) {
    *max_args = (int)LineSpecialNames[iVar2].max_args;
  }
  return LineSpecialNames[iVar2].number;
}

Assistant:

int P_FindLineSpecial (const char *string, int *min_args, int *max_args)
{
	int min = 0, max = countof(LineSpecialNames) - 1;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		int lexval = stricmp (string, LineSpecialNames[mid].name);
		if (lexval == 0)
		{
			if (min_args != NULL) *min_args = LineSpecialNames[mid].min_args;
			if (max_args != NULL) *max_args = LineSpecialNames[mid].max_args;
			return LineSpecialNames[mid].number;
		}
		else if (lexval > 0)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return 0;
}